

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.cpp
# Opt level: O1

bool __thiscall
indigox::algorithm::ItemCompare::operator()
          (ItemCompare *this,p_AStarQueueItem *a,p_AStarQueueItem *b)

{
  Score SVar1;
  Score SVar2;
  element_type *peVar3;
  element_type *peVar4;
  size_type sVar5;
  size_type sVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  bool bVar10;
  
  peVar3 = (a->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if ((peVar3->path_cost == Options::AssignElectrons::INF) ||
     (peVar3->heuristic_cost == Options::AssignElectrons::INF)) {
    peVar3 = (b->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>)
             ._M_ptr;
    if (peVar3->path_cost != Options::AssignElectrons::INF) {
      return peVar3->heuristic_cost != Options::AssignElectrons::INF;
    }
  }
  else {
    peVar4 = (b->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>)
             ._M_ptr;
    SVar1 = peVar4->path_cost;
    if ((SVar1 != Options::AssignElectrons::INF) &&
       (SVar2 = peVar4->heuristic_cost, SVar2 != Options::AssignElectrons::INF)) {
      uVar7 = peVar3->heuristic_cost + peVar3->path_cost;
      uVar8 = SVar2 + SVar1;
      bVar9 = uVar7 < uVar8;
      bVar10 = uVar7 == uVar8;
      if (bVar10) {
        sVar5 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count
                          (&peVar3->calculable);
        sVar6 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count
                          (&((b->
                             super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr)->calculable);
        bVar9 = sVar5 < sVar6;
        bVar10 = sVar5 == sVar6;
      }
      return !bVar9 && !bVar10;
    }
  }
  return false;
}

Assistant:

bool ItemCompare::operator()(const p_AStarQueueItem a, const p_AStarQueueItem b)  {
  if (a->path_cost == opt_::INF || a->heuristic_cost == opt_::INF) {
    if (b->path_cost == opt_::INF || b->heuristic_cost == opt_::INF)
      return false;
    else
      return true;
  } else if (b->path_cost == opt_::INF || b->heuristic_cost == opt_::INF)
    return false;
  else if ((a->path_cost+a->heuristic_cost) == (b->path_cost+b->heuristic_cost))
    return (a->calculable.count()) > (b->calculable.count());
  else return (a->path_cost+a->heuristic_cost) > (b->path_cost+b->heuristic_cost);
}